

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O3

xmlEntityPtr
xmlAddEntity(xmlDtdPtr dtd,xmlChar *name,int type,xmlChar *ExternalID,xmlChar *SystemID,
            xmlChar *content)

{
  int iVar1;
  void **ppvVar2;
  xmlHashTablePtr table;
  xmlEntityPtr entity;
  _xmlDict *dict;
  
  if (name == (xmlChar *)0x0) {
    return (xmlEntityPtr)0x0;
  }
  if (dtd->doc == (_xmlDoc *)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = dtd->doc->dict;
  }
  if (type - 1U < 3) {
    table = (xmlHashTablePtr)dtd->entities;
    if (table != (xmlHashTablePtr)0x0) goto LAB_001460f7;
    ppvVar2 = &dtd->entities;
  }
  else {
    if (1 < type - 4U) {
      return (xmlEntityPtr)0x0;
    }
    table = (xmlHashTablePtr)dtd->pentities;
    if (table != (xmlHashTablePtr)0x0) goto LAB_001460f7;
    ppvVar2 = &dtd->pentities;
  }
  table = xmlHashCreateDict(0,dict);
  *ppvVar2 = table;
  if (table == (xmlHashTablePtr)0x0) {
    return (xmlEntityPtr)0x0;
  }
LAB_001460f7:
  entity = xmlCreateEntity(dict,name,type,ExternalID,SystemID,content);
  if (entity != (xmlEntityPtr)0x0) {
    entity->doc = dtd->doc;
    iVar1 = xmlHashAddEntry(table,name,entity);
    if (iVar1 == 0) {
      return entity;
    }
    xmlFreeEntity(entity);
  }
  return (xmlEntityPtr)0x0;
}

Assistant:

static xmlEntityPtr
xmlAddEntity(xmlDtdPtr dtd, const xmlChar *name, int type,
	  const xmlChar *ExternalID, const xmlChar *SystemID,
	  const xmlChar *content) {
    xmlDictPtr dict = NULL;
    xmlEntitiesTablePtr table = NULL;
    xmlEntityPtr ret;

    if (name == NULL)
	return(NULL);
    if (dtd == NULL)
	return(NULL);
    if (dtd->doc != NULL)
        dict = dtd->doc->dict;

    switch (type) {
        case XML_INTERNAL_GENERAL_ENTITY:
        case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
        case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
	    if (dtd->entities == NULL)
		dtd->entities = xmlHashCreateDict(0, dict);
	    table = dtd->entities;
	    break;
        case XML_INTERNAL_PARAMETER_ENTITY:
        case XML_EXTERNAL_PARAMETER_ENTITY:
	    if (dtd->pentities == NULL)
		dtd->pentities = xmlHashCreateDict(0, dict);
	    table = dtd->pentities;
	    break;
        case XML_INTERNAL_PREDEFINED_ENTITY:
	    return(NULL);
    }
    if (table == NULL)
	return(NULL);
    ret = xmlCreateEntity(dict, name, type, ExternalID, SystemID, content);
    if (ret == NULL)
        return(NULL);
    ret->doc = dtd->doc;

    if (xmlHashAddEntry(table, name, ret)) {
	/*
	 * entity was already defined at another level.
	 */
        xmlFreeEntity(ret);
	return(NULL);
    }
    return(ret);
}